

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  uint8 *puVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  ParseFlags PVar5;
  int iVar6;
  ParseStatus PVar7;
  int iVar8;
  string *utf;
  Regexp *pRVar9;
  CharClassBuilder *pCVar10;
  UGroup *g;
  Regexp *pRVar11;
  RegexpStatus *this;
  RegexpOp RVar12;
  bool bVar13;
  Rune r;
  int hi;
  ParseState ps;
  int lo;
  RegexpStatus xstatus;
  StringPiece local_d8;
  StringPiece local_c8;
  int local_ac;
  ParseState local_a8;
  int local_74;
  RegexpStatus *local_70;
  StringPiece local_68;
  RegexpStatus local_50;
  
  local_70 = &local_50;
  this = status;
  if (status == (RegexpStatus *)0x0) {
    this = local_70;
  }
  bVar13 = (global_flags & Latin1) == NoParseFlags;
  local_a8.rune_max_ = 0xff;
  if (bVar13) {
    local_a8.rune_max_ = 0x10ffff;
  }
  local_50.code_ = kRegexpSuccess;
  local_50.error_arg_.ptr_ = (char *)0x0;
  local_50.error_arg_.length_ = 0;
  local_50.tmp_ = (string *)0x0;
  local_a8.whole_regexp_.ptr_ = s->ptr_;
  local_a8.whole_regexp_.length_ = s->length_;
  local_a8.whole_regexp_._12_4_ = *(undefined4 *)&s->field_0xc;
  local_a8.stacktop_ = (Regexp *)0x0;
  local_a8.ncap_ = 0;
  local_d8.ptr_ = s->ptr_;
  local_d8._8_8_ = *(undefined8 *)&s->length_;
  local_a8.flags_ = global_flags;
  local_a8.status_ = this;
  if (!bVar13) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_d8,utf);
    RegexpStatus::set_tmp(this,utf);
    local_d8.ptr_ = (utf->_M_dataplus)._M_p;
    local_d8.length_ = (int)utf->_M_string_length;
  }
  if ((global_flags & Literal) == NoParseFlags) {
    if (status != (RegexpStatus *)0x0) {
      local_70 = status;
    }
    pRVar11 = (Regexp *)0x0;
    iVar8 = 0;
    do {
      PVar5 = local_a8.flags_;
      pRVar9 = (Regexp *)local_d8.ptr_;
      iVar6 = local_d8.length_;
      if (local_d8.length_ < 1) {
        pRVar11 = ParseState::DoFinish(&local_a8);
        goto LAB_0012ff68;
      }
      bVar2 = *(uint8 *)local_d8.ptr_;
      uVar4 = local_d8._12_4_;
      if (0x3e < bVar2) {
        if (0x5d < bVar2) {
          if (bVar2 == 0x5e) {
            ParseState::PushCarat(&local_a8);
            goto LAB_0012fe7e;
          }
          if (bVar2 != 0x7b) {
            if (bVar2 != 0x7c) goto switchD_0012f8c7_caseD_25;
            ParseState::DoVerticalBar(&local_a8);
            goto LAB_0012fe7e;
          }
          local_68.ptr_ = local_d8.ptr_;
          local_68.length_ = local_d8.length_;
          local_68._12_4_ = local_d8._12_4_;
          local_c8.ptr_ = local_d8.ptr_;
          local_c8.length_ = local_d8.length_;
          local_c8._12_4_ = local_d8._12_4_;
          if ((iVar6 == 0) || (*(uint8 *)local_d8.ptr_ != '{')) {
LAB_0012fe6f:
            ParseState::PushLiteral(&local_a8,0x7b);
            goto LAB_0012fe7e;
          }
          local_c8.ptr_ = (char *)((long)local_d8.ptr_ + 1);
          local_c8._12_4_ = uVar4;
          local_c8.length_ = iVar6 + -1;
          bVar13 = ParseInteger(&local_c8,&local_74);
          if ((!bVar13) || (local_c8.length_ == 0)) goto LAB_0012fe6f;
          if (*(uint8 *)local_c8.ptr_ == ',') {
            local_c8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
            iVar6 = local_c8.length_ + -1;
            local_c8.length_ = iVar6;
            if (iVar6 == 0) goto LAB_0012fe6f;
            if ((char)*(uint16 *)local_c8.ptr_ == '}') {
              local_ac = -1;
            }
            else {
              bVar13 = ParseInteger(&local_c8,&local_ac);
              if (!bVar13) goto LAB_0012fe6f;
            }
          }
          else {
            local_ac = local_74;
          }
          pRVar9 = (Regexp *)local_68.ptr_;
          if ((local_c8.length_ == 0) || (*(uint8 *)local_c8.ptr_ != '}')) goto LAB_0012fe6f;
          local_d8.ptr_ = (char *)((long)local_c8.ptr_ + 1);
          local_d8.length_ = local_c8.length_ + -1;
          if ((local_a8.flags_ & PerlX) == NoParseFlags) {
            bVar13 = false;
LAB_0012fecf:
            iVar6 = (int)local_d8.ptr_ - (int)local_68.ptr_;
            local_68.length_ = iVar6;
            bVar13 = ParseState::PushRepetition(&local_a8,local_74,local_ac,&local_68,bVar13);
            goto LAB_0012fa66;
          }
          if ((local_c8.length_ + -1 < 1) || (*local_d8.ptr_ != '?')) {
            bVar13 = false;
          }
          else {
            local_d8.ptr_ = (char *)((long)local_c8.ptr_ + 2);
            local_d8.length_ = local_c8.length_ + -2;
            bVar13 = true;
          }
          if (iVar8 < 1) goto LAB_0012fecf;
          goto LAB_0012fa28;
        }
        if (bVar2 == 0x3f) {
          RVar12 = kRegexpQuest;
          goto LAB_0012f9e1;
        }
        if (bVar2 == 0x5b) {
          bVar13 = ParseState::ParseCharClass(&local_a8,&local_d8,(Regexp **)&local_c8,this);
          if (!bVar13) goto LAB_0012fe50;
          ParseState::PushRegexp(&local_a8,(Regexp *)local_c8.ptr_);
LAB_0012fab0:
          iVar6 = 1;
          if (bVar13 != false) goto LAB_0012fe86;
          goto LAB_0012fe94;
        }
        if (bVar2 != 0x5c) goto switchD_0012f8c7_caseD_25;
        if (local_d8.length_ != 1 && (local_a8.flags_ >> 8 & 1) != 0) {
          if (*(uint8 *)((long)local_d8.ptr_ + 1) == 'b') {
            RVar12 = kRegexpWordBoundary;
          }
          else {
            if (*(uint8 *)((long)local_d8.ptr_ + 1) != 'B') goto LAB_0012fbab;
            RVar12 = kRegexpNoWordBoundary;
          }
          ParseState::PushSimpleOp(&local_a8,RVar12);
          goto LAB_0012fc04;
        }
LAB_0012fbab:
        if (local_d8.length_ == 1 || (local_a8.flags_ >> 9 & 1) == 0) {
LAB_0012fc32:
          if ((local_d8.length_ != 1) && ((*(uint8 *)((long)local_d8.ptr_ + 1) | 0x20) == 0x70)) {
            pRVar9 = (Regexp *)operator_new(0x28);
            Regexp(pRVar9,kRegexpCharClass,PVar5 & ~FoldCase);
            pCVar10 = (CharClassBuilder *)operator_new(0x40);
            CharClassBuilder::CharClassBuilder(pCVar10);
            (pRVar9->field_7).field_3.ccb_ = pCVar10;
            PVar7 = ParseUnicodeGroup(&local_d8,PVar5,pCVar10,this);
            if (PVar7 == kParseOk) {
              iVar6 = 0xb;
              ParseState::PushRegexp(&local_a8,pRVar9);
            }
            else if (PVar7 == kParseError) {
              iVar6 = 1;
              Decref(pRVar9);
            }
            else {
              iVar6 = 0;
              if (PVar7 == kParseNothing) {
                Decref(pRVar9);
              }
            }
            if (iVar6 == 0xb) goto LAB_0012fe86;
            if (iVar6 != 0) goto LAB_0012fe94;
          }
          PVar5 = local_a8.flags_;
          g = MaybeParsePerlCCEscape(&local_d8,local_a8.flags_);
          if (g != (UGroup *)0x0) {
            pRVar11 = (Regexp *)operator_new(0x28);
            Regexp(pRVar11,kRegexpCharClass,PVar5 & ~FoldCase);
            pCVar10 = (CharClassBuilder *)operator_new(0x40);
            CharClassBuilder::CharClassBuilder(pCVar10);
            (pRVar11->field_7).field_3.ccb_ = pCVar10;
            AddUGroup(pCVar10,g,g->sign,PVar5);
            ParseState::PushRegexp(&local_a8,pRVar11);
            goto LAB_0012fe86;
          }
          bVar13 = ParseEscape(&local_d8,(Rune *)&local_c8,this,local_a8.rune_max_);
          if (!bVar13) goto LAB_0012fe50;
          ParseState::PushLiteral(&local_a8,(Rune)local_c8.ptr_);
          goto LAB_0012fab0;
        }
        bVar2 = *(uint8 *)((long)local_d8.ptr_ + 1);
        if (bVar2 < 0x51) {
          if (bVar2 == 0x41) {
            ParseState::PushSimpleOp(&local_a8,kRegexpBeginText);
          }
          else {
            if (bVar2 != 0x43) goto LAB_0012fc32;
            ParseState::PushSimpleOp(&local_a8,kRegexpAnyByte);
          }
LAB_0012fc04:
          local_d8.ptr_ = (char *)((long)local_d8.ptr_ + 2);
          local_d8.length_ = local_d8.length_ + -2;
          goto LAB_0012fe86;
        }
        if (bVar2 != 0x51) {
          if (bVar2 != 0x7a) goto LAB_0012fc32;
          ParseState::PushSimpleOp(&local_a8,kRegexpEndText);
          goto LAB_0012fc04;
        }
        local_d8.ptr_ = (char *)((long)local_d8.ptr_ + 2);
        local_d8.length_ = local_d8.length_ + -2;
        iVar3 = local_d8.length_;
        if (iVar6 < 3) goto LAB_0012fe86;
        do {
          if (((iVar3 != 1) && (*(uint8 *)local_d8.ptr_ == '\\')) &&
             (*(uint8 *)((long)local_d8.ptr_ + 1) == 'E')) {
            local_d8.ptr_ = (char *)((long)local_d8.ptr_ + 2);
            local_d8.length_ = iVar3 + -2;
            goto LAB_0012fe86;
          }
          iVar6 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
          if (iVar6 < 0) goto LAB_0012fe50;
          ParseState::PushLiteral(&local_a8,(Rune)local_c8.ptr_);
          pRVar9 = (Regexp *)0x0;
          iVar3 = local_d8.length_;
          iVar6 = 0;
        } while (0 < local_d8.length_);
        goto LAB_0012fe8b;
      }
      switch(bVar2) {
      case 0x24:
        ParseState::PushDollar(&local_a8);
        break;
      default:
switchD_0012f8c7_caseD_25:
        iVar6 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
        if (iVar6 < 0) goto LAB_0012fe50;
        ParseState::PushLiteral(&local_a8,(Rune)local_c8.ptr_);
        goto LAB_0012fe86;
      case 0x28:
        if ((local_d8.length_ == 1 || (local_a8.flags_ >> 9 & 1) == 0) ||
           (*(uint8 *)((long)local_d8.ptr_ + 1) != '?')) {
          if ((local_a8.flags_ >> 0xc & 1) == 0) {
            local_c8.ptr_ = (char *)0x0;
            local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
            ParseState::DoLeftParen(&local_a8,&local_c8);
          }
          else {
            ParseState::DoLeftParenNoCapture(&local_a8);
          }
          break;
        }
        bVar13 = ParseState::ParsePerlFlags(&local_a8,&local_d8);
        iVar6 = 1;
        if (bVar13) goto LAB_0012fe86;
        goto LAB_0012fe94;
      case 0x29:
        bVar13 = ParseState::DoRightParen(&local_a8);
        iVar6 = 1;
        if (!bVar13) goto LAB_0012fe94;
        break;
      case 0x2a:
        RVar12 = kRegexpStar;
        goto LAB_0012f9e1;
      case 0x2b:
        RVar12 = kRegexpPlus;
LAB_0012f9e1:
        local_c8.ptr_ = local_d8.ptr_;
        local_c8.length_ = local_d8.length_;
        local_c8._12_4_ = local_d8._12_4_;
        puVar1 = (uint8 *)((long)local_d8.ptr_ + 1);
        local_d8.length_ = iVar6 + -1;
        local_d8._8_8_ = CONCAT44(uVar4,local_d8.length_);
        if ((local_a8.flags_ & PerlX) == NoParseFlags) {
          bVar13 = false;
          local_d8.ptr_ = (char *)puVar1;
LAB_0012fa45:
          iVar6 = (int)local_d8.ptr_ - (int)pRVar9;
          local_c8._12_4_ = uVar4;
          local_c8.length_ = iVar6;
          bVar13 = ParseState::PushRepeatOp(&local_a8,RVar12,&local_c8,bVar13);
LAB_0012fa66:
          if (bVar13 == false) goto LAB_0012fe50;
          goto LAB_0012fe8b;
        }
        if ((iVar6 == 1) || (*puVar1 != '?')) {
          bVar13 = false;
          local_d8.ptr_ = (char *)puVar1;
        }
        else {
          local_d8.length_ = iVar6 + -2;
          local_d8._8_8_ = CONCAT44(uVar4,local_d8.length_);
          bVar13 = true;
          local_d8.ptr_ = (char *)((long)local_d8.ptr_ + 2);
        }
        if (iVar8 < 1) goto LAB_0012fa45;
LAB_0012fa28:
        this->code_ = kRegexpRepeatOp;
        (local_70->error_arg_).ptr_ = (char *)pRVar11;
        (local_70->error_arg_).length_ = (int)local_d8.ptr_ - (int)pRVar11;
LAB_0012fe50:
        iVar6 = 1;
        goto LAB_0012fe94;
      case 0x2e:
        ParseState::PushDot(&local_a8);
      }
LAB_0012fe7e:
      local_d8.ptr_ = (char *)((long)local_d8.ptr_ + 1);
      local_d8.length_ = local_d8.length_ + -1;
LAB_0012fe86:
      pRVar9 = (Regexp *)0x0;
      iVar6 = 0;
LAB_0012fe8b:
      iVar8 = iVar6;
      iVar6 = 0;
      pRVar11 = pRVar9;
LAB_0012fe94:
    } while (iVar6 == 0);
LAB_0012ff57:
    pRVar11 = (Regexp *)0x0;
  }
  else {
    if (0 < local_d8.length_) {
      do {
        iVar8 = StringPieceToRune((Rune *)&local_c8,&local_d8,this);
        if (iVar8 < 0) goto LAB_0012ff57;
        ParseState::PushLiteral(&local_a8,(Rune)local_c8.ptr_);
      } while (0 < local_d8.length_);
    }
    pRVar11 = ParseState::DoFinish(&local_a8);
  }
LAB_0012ff68:
  ParseState::~ParseState(&local_a8);
  RegexpStatus::~RegexpStatus(&local_50);
  return pRVar11;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    string* tmp = new string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = NULL;
  while (t.size() > 0) {
    StringPiece isunary = NULL;
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(NULL))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(
                StringPiece(lastunary.begin(),
                            static_cast<int>(t.begin() - lastunary.begin())));
            return NULL;
          }
        }
        opstr.set(opstr.data(), static_cast<int>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}